

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::fill<fmt::v10::appender,char>(appender it,size_t n,fill_t<char> *fill)

{
  size_t sVar1;
  fill_t<char> *in_RDX;
  ulong in_RSI;
  buffer<char> *in_RDI;
  size_t i;
  char *data;
  size_t fill_size;
  char *in_stack_ffffffffffffffa8;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffffb8;
  unsigned_long in_stack_ffffffffffffffc0;
  ulong uVar2;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffffc8;
  undefined8 local_10;
  undefined8 local_8;
  
  sVar1 = fill_t<char>::size(in_RDX);
  if (sVar1 == 1) {
    fill_t<char>::operator[](in_RDX,0);
    local_8 = (buffer<char> *)
              fill_n<fmt::v10::appender,unsigned_long,char>
                        (in_stack_ffffffffffffffc8.container,in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8.container);
  }
  else {
    fill_t<char>::data(in_RDX);
    local_10 = in_RDI;
    for (uVar2 = 0; uVar2 < in_RSI; uVar2 = uVar2 + 1) {
      in_stack_ffffffffffffffb8.container =
           (buffer<char> *)
           copy_str<char,char_const*>
                     (local_10,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb8.container);
      local_10 = in_stack_ffffffffffffffb8.container;
    }
    local_8 = local_10;
  }
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_8;
}

Assistant:

FMT_NOINLINE FMT_CONSTEXPR auto fill(OutputIt it, size_t n,
                                     const fill_t<Char>& fill) -> OutputIt {
  auto fill_size = fill.size();
  if (fill_size == 1) return detail::fill_n(it, n, fill[0]);
  auto data = fill.data();
  for (size_t i = 0; i < n; ++i)
    it = copy_str<Char>(data, data + fill_size, it);
  return it;
}